

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_ptr __thiscall mjs::parser::parse_statement(parser *this,bool check_for_strict_mode)

{
  uint uVar1;
  token *this_00;
  _Alloc_hider _Var2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 extraout_RAX;
  wstring *pwVar6;
  wostream *pwVar7;
  char *pcVar8;
  char in_DL;
  wchar_t *extraout_RDX;
  wstring_view *s;
  undefined8 uVar9;
  undefined7 in_register_00000031;
  parser *this_01;
  undefined8 uVar10;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wstring_view id;
  wstring_view name;
  wstring catch_id;
  wstring n;
  undefined1 local_5e0 [24];
  anon_union_32_3_e608ca2d_for_token_1 local_5c8;
  pointer local_5a8;
  undefined1 local_5a0 [8];
  undefined1 local_598 [8];
  wostringstream _oss;
  undefined1 local_588 [24];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_570 [10];
  ulong local_418;
  position_stack_node _statement_position__LINE__;
  token local_3f0;
  token local_3c8;
  token local_3a0;
  token local_378;
  token local_350;
  token local_328;
  token local_300;
  token local_2d8;
  token local_2b0;
  token local_288;
  token local_260;
  token local_238;
  token local_210;
  token local_1e8;
  token local_1c0;
  token local_198;
  token local_170;
  token local_148;
  token local_120;
  token local_f8;
  token local_d0;
  token local_a8;
  token local_80;
  token local_58;
  
  this_01 = (parser *)CONCAT71(in_register_00000031,check_for_strict_mode);
  _statement_position__LINE__.stack_ = &this_01->statement_pos_;
  pcVar8 = (char *)&_statement_position__LINE__;
  _statement_position__LINE__.prev_ = this_01->statement_pos_;
  this_01->statement_pos_ = (position_stack_node *)pcVar8;
  _statement_position__LINE__.pos_ = this_01->token_start_;
  _statement_position__LINE__.parent_ = this_01;
  if ((this_01->current_token_).type_ == lbrace) {
    parse_block(this,check_for_strict_mode);
    goto LAB_0017e2d4;
  }
  iVar5 = (int)this_01;
  accept((parser *)&_oss,iVar5,(sockaddr *)0x4d,(socklen_t *)pcVar8);
  uVar3 = __oss;
  token::destroy((token *)&_oss);
  if (uVar3 != L'r') {
    current_extend((source_extend *)&n,this_01);
    expect((token *)&_oss,this_01,identifier,"parse_statement",0x350);
    pwVar6 = token::text_abi_cxx11_((token *)&_oss);
    std::__cxx11::wstring::wstring((wstring *)&catch_id,(wstring *)pwVar6);
    token::destroy((token *)&_oss);
    parse_function_abi_cxx11_
              ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                *)&_oss,this_01);
    iVar5 = (**(code **)(*(long *)__oss + 0x18))();
    if (iVar5 != 0) {
      __assert_fail("block->type() == statement_type::block",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x352,"statement_ptr mjs::parser::parse_statement(bool)");
    }
    if (*(char *)(__oss + 0x38) == '\x01') {
      id._M_str = catch_id._M_dataplus._M_p;
      id._M_len = catch_id._M_string_length;
      check_function_name(this_01,id,(source_extend *)&n);
    }
    make_statement<mjs::function_definition,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(source_extend *)this_01,local_570,
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)&catch_id,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_588);
    std::
    _Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                    *)&_oss);
    std::__cxx11::wstring::~wstring((wstring *)&catch_id);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n._M_string_length);
    goto LAB_0017e2d4;
  }
  accept((parser *)&_oss,iVar5,(sockaddr *)0x6c,(socklen_t *)pcVar8);
  uVar3 = __oss;
  token::destroy((token *)&_oss);
  if (uVar3 != L'r') {
    parse_variable_declaration_list((list *)&_oss,this_01);
    expect_semicolon_allow_insertion(this_01,"parse_statement",0x359);
    make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
              (this,(vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)this_01);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector
              ((vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)&_oss);
    goto LAB_0017e2d4;
  }
  this_00 = &this_01->current_token_;
  if (this_00->type_ == semicolon) {
    get_token(&local_58,this_01);
    token::destroy(&local_58);
    make_statement<mjs::empty_statement>(this);
    goto LAB_0017e2d4;
  }
  accept((parser *)&_oss,iVar5,(sockaddr *)0x4f,(socklen_t *)pcVar8);
  uVar3 = __oss;
  token::destroy((token *)&_oss);
  if (uVar3 == L'r') {
    accept((parser *)&_oss,iVar5,(sockaddr *)0x42,(socklen_t *)pcVar8);
    uVar3 = __oss;
    token::destroy((token *)&_oss);
    if (uVar3 == L'r') {
      accept((parser *)&_oss,iVar5,(sockaddr *)0x6f,(socklen_t *)pcVar8);
      uVar3 = __oss;
      token::destroy((token *)&_oss);
      if (uVar3 == L'r') {
        accept((parser *)&_oss,iVar5,(sockaddr *)0x4c,(socklen_t *)pcVar8);
        uVar3 = __oss;
        token::destroy((token *)&_oss);
        if (uVar3 != L'r') {
          catch_id._M_dataplus._M_p = (pointer)0x0;
          n._M_dataplus._M_p = (pointer)0x0;
          local_5c8.ivalue_ = 0;
          pcVar8 = "parse_statement";
          expect(&local_1c0,this_01,lparen,"parse_statement",0x376);
          token::destroy(&local_1c0);
          accept((parser *)&_oss,iVar5,(sockaddr *)0x34,(socklen_t *)pcVar8);
          uVar3 = __oss;
          token::destroy((token *)&_oss);
          if (uVar3 == L'r') {
            this_01->supress_in_ = true;
            accept((parser *)&_oss,iVar5,(sockaddr *)0x6c,(socklen_t *)pcVar8);
            uVar3 = __oss;
            token::destroy((token *)&_oss);
            if (uVar3 == L'r') {
              parse_expression((parser *)local_5e0);
              make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                        ((parser *)&_oss,
                         (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                         this_01);
              uVar9 = __oss;
              _Var2 = catch_id._M_dataplus;
              __oss = (long *)0x0;
              catch_id._M_dataplus._M_p = (pointer)uVar9;
              if ((_Var2._M_p != (pointer)0x0) &&
                 ((**(code **)(*(long *)_Var2._M_p + 8))(), (long *)__oss != (long *)0x0)) {
                (**(code **)(*(long *)__oss + 8))();
              }
              __oss = (pointer)0x0;
              if ((pointer)local_5e0._0_8_ != (pointer)0x0) {
                (**(code **)(*(long *)local_5e0._0_8_ + 8))();
              }
            }
            else {
              parse_variable_declaration_list((list *)&_oss,this_01);
              make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
                        ((parser *)local_5e0,
                         (vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)this_01);
              uVar9 = local_5e0._0_8_;
              _Var2 = catch_id._M_dataplus;
              local_5e0._0_8_ = (long *)0x0;
              catch_id._M_dataplus._M_p = (pointer)uVar9;
              if ((_Var2._M_p != (pointer)0x0) &&
                 ((**(code **)(*(long *)_Var2._M_p + 8))(), (long *)local_5e0._0_8_ != (long *)0x0))
              {
                (**(code **)(*(long *)local_5e0._0_8_ + 8))();
              }
              local_5e0._0_8_ = (pointer)0x0;
              std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector
                        ((vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)&_oss);
            }
            this_01->supress_in_ = false;
            accept((parser *)&_oss,iVar5,(sockaddr *)0x52,(socklen_t *)pcVar8);
            uVar3 = __oss;
            token::destroy((token *)&_oss);
            if (uVar3 != L'r') {
              iVar5 = (**(code **)(*(long *)catch_id._M_dataplus._M_p + 0x18))();
              if ((iVar5 == 1) &&
                 (*(long *)(catch_id._M_dataplus._M_p + 10) -
                  *(long *)(catch_id._M_dataplus._M_p + 8) != 0x28)) {
                unhandled(this_01,"parse_statement",899);
              }
              parse_expression((parser *)&_oss);
              expect(&local_1e8,this_01,rparen,"parse_statement",0x387);
              token::destroy(&local_1e8);
              parse_statement((parser *)local_5e0,check_for_strict_mode);
              make_statement<mjs::for_in_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                        (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                              this_01,
                         (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                         &catch_id,
                         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&_oss);
              uVar9 = __oss;
              if ((pointer)local_5e0._0_8_ != (pointer)0x0) {
                (**(code **)(*(long *)local_5e0._0_8_ + 8))();
                uVar9 = __oss;
              }
              goto LAB_0017e201;
            }
            pcVar8 = "parse_statement";
            expect(&local_210,this_01,semicolon,"parse_statement",0x38a);
            token::destroy(&local_210);
          }
          accept((parser *)&_oss,iVar5,(sockaddr *)0x34,(socklen_t *)pcVar8);
          uVar3 = __oss;
          token::destroy((token *)&_oss);
          if (uVar3 == L'r') {
            parse_expression((parser *)&_oss);
            n._M_dataplus._M_p = (pointer)__oss;
            pcVar8 = "parse_statement";
            expect(&local_238,this_01,semicolon,"parse_statement",0x38e);
            token::destroy(&local_238);
          }
          accept((parser *)&_oss,iVar5,(sockaddr *)0x2f,(socklen_t *)pcVar8);
          uVar3 = __oss;
          token::destroy((token *)&_oss);
          if (uVar3 == L'r') {
            parse_expression((parser *)&_oss);
            local_5c8.ivalue_ = __oss;
            expect(&local_260,this_01,rparen,"parse_statement",0x392);
            token::destroy(&local_260);
          }
          parse_statement((parser *)&_oss,check_for_strict_mode);
          make_statement<mjs::for_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                    (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                          this_01,
                     (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&catch_id
                     ,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&n,
                     (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                     (local_5e0 + 0x18));
          uVar9 = local_5c8.ivalue_;
          if ((pointer)__oss != (pointer)0x0) {
            (**(code **)(*(long *)__oss + 8))();
            uVar9 = local_5c8.ivalue_;
          }
          goto LAB_0017e201;
        }
        accept((parser *)&_oss,iVar5,(sockaddr *)0x3e,(socklen_t *)pcVar8);
        uVar3 = __oss;
        token::destroy((token *)&_oss);
        if (uVar3 == L'r') {
          accept((parser *)&_oss,iVar5,(sockaddr *)0x37,(socklen_t *)pcVar8);
          uVar3 = __oss;
          token::destroy((token *)&_oss);
          if (uVar3 == L'r') {
            accept((parser *)&_oss,iVar5,(sockaddr *)0x5f,(socklen_t *)pcVar8);
            uVar3 = __oss;
            token::destroy((token *)&_oss);
            if (uVar3 == L'r') {
              if (this_00->type_ == with_) {
                if (this_01->strict_mode_ == true) {
                  std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
                  std::operator<<((wostream *)&_oss,
                                  "Strict mode code may not include a WithStatement");
                  current_extend((source_extend *)&n,this_01);
                  std::__cxx11::wstringbuf::str();
                  message._M_str = in_R9;
                  message._M_len = (size_t)catch_id._M_dataplus._M_p;
                  syntax_error((parser *)"parse_statement",(char *)0x3a7,(int)&n,
                               (source_extend *)catch_id._M_string_length,message);
                }
                get_token(&local_288,this_01);
                token::destroy(&local_288);
                expect(&local_2b0,this_01,lparen,"parse_statement",0x3aa);
                token::destroy(&local_2b0);
                parse_expression((parser *)&_oss);
                expect(&local_2d8,this_01,rparen,"parse_statement",0x3ac);
                token::destroy(&local_2d8);
                parse_statement((parser *)&catch_id,check_for_strict_mode);
                make_statement<mjs::with_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                          (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)this_01,
                           (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&_oss
                          );
                goto LAB_0017e2b2;
              }
              accept((parser *)&_oss,iVar5,(sockaddr *)0x63,(socklen_t *)pcVar8);
              uVar3 = __oss;
              token::destroy((token *)&_oss);
              if (uVar3 == L'r') {
                accept((parser *)&_oss,iVar5,(sockaddr *)0x66,(socklen_t *)pcVar8);
                uVar3 = __oss;
                token::destroy((token *)&_oss);
                if (uVar3 == L'r') {
                  accept((parser *)&_oss,iVar5,(sockaddr *)0x6a,(socklen_t *)pcVar8);
                  uVar3 = __oss;
                  token::destroy((token *)&_oss);
                  if (uVar3 == L'r') {
                    accept((parser *)&_oss,iVar5,(sockaddr *)0x3f,(socklen_t *)pcVar8);
                    uVar3 = __oss;
                    token::destroy((token *)&_oss);
                    if (uVar3 != L'r') {
                      make_statement<mjs::debugger_statement>(this);
                      expect_semicolon_allow_insertion(this_01,"parse_statement",0x3f0);
                      goto LAB_0017e2d4;
                    }
                    parse_expression((parser *)&catch_id);
                    if (0 < (int)this_01->version_) {
                      accept((parser *)&_oss,iVar5,(sockaddr *)0x24,(socklen_t *)pcVar8);
                      uVar3 = __oss;
                      token::destroy((token *)&_oss);
                      if (uVar3 != L'r') {
                        iVar5 = (**(code **)(*(long *)catch_id._M_dataplus._M_p + 0x18))();
                        _Var2 = catch_id._M_dataplus;
                        if (iVar5 != 0) {
                          unhandled(this_01,"parse_statement",0x3f7);
                        }
                        parse_statement((parser *)&_oss,check_for_strict_mode);
                        make_statement<mjs::labelled_statement,std::__cxx11::wstring_const&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                                  (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)this_01,
                                   (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                    *)(_Var2._M_p + 8));
                        uVar10 = __oss;
                        goto LAB_0017e211;
                      }
                    }
                    if ((in_DL != '\0') &&
                       (bVar4 = is_strict_mode_directive((expression *)catch_id._M_dataplus._M_p),
                       bVar4)) {
                      this_01->strict_mode_ = true;
                    }
                    expect_semicolon_allow_insertion(this_01,"parse_statement",0x401);
                    make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                     *)this_01);
                    local_598 = (undefined1  [8])catch_id._M_dataplus;
                  }
                  else {
                    parse_block((parser *)local_598,check_for_strict_mode);
                    local_5a0 = (undefined1  [8])0x0;
                    local_5a8 = (pointer)0x0;
                    catch_id._M_dataplus._M_p = (pointer)&catch_id.field_2;
                    catch_id._M_string_length = 0;
                    catch_id.field_2._M_allocated_capacity =
                         catch_id.field_2._M_allocated_capacity & 0xffffffff00000000;
                    accept((parser *)&_oss,iVar5,(sockaddr *)0x3a,(socklen_t *)pcVar8);
                    uVar3 = __oss;
                    token::destroy((token *)&_oss);
                    if (uVar3 != L'r') {
                      expect(&local_3c8,this_01,lparen,"parse_statement",0x3df);
                      token::destroy(&local_3c8);
                      if ((this_01->strict_mode_ == true) &&
                         ((this_01->current_token_).type_ == identifier)) {
                        pwVar6 = token::text_abi_cxx11_(this_00);
                        std::__cxx11::wstring::wstring((wstring *)&n,(wstring *)pwVar6);
                        name._M_str = extraout_RDX;
                        name._M_len = (size_t)n._M_dataplus._M_p;
                        bVar4 = is_strict_mode_unassignable_identifier
                                          ((mjs *)n._M_string_length,name);
                        if (bVar4) {
                          std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
                          pwVar7 = std::operator<<((wostream *)&_oss,"\"");
                          local_5e0._0_8_ = n._M_string_length;
                          local_5e0._8_8_ = n._M_dataplus._M_p;
                          cpp_quote_abi_cxx11_((wstring *)(local_5e0 + 0x18),(mjs *)local_5e0,s);
                          pwVar7 = std::operator<<(pwVar7,(wstring *)(local_5e0 + 0x18));
                          std::operator<<(pwVar7,
                                          "\" may not be used as an identifier in strict mode");
                          std::__cxx11::wstring::~wstring((wstring *)(local_5e0 + 0x18));
                          current_extend((source_extend *)local_5e0,this_01);
                          std::__cxx11::wstringbuf::str();
                          message_00._M_str = in_R9;
                          message_00._M_len = local_5c8.ivalue_;
                          syntax_error((parser *)"parse_statement",(char *)0x3e3,(int)local_5e0,
                                       (source_extend *)local_5c8.text_._M_string_length,message_00)
                          ;
                        }
                        std::__cxx11::wstring::~wstring((wstring *)&n);
                      }
                      expect((token *)&_oss,this_01,identifier,"parse_statement",0x3e6);
                      token::text_abi_cxx11_((token *)&_oss);
                      std::__cxx11::wstring::_M_assign((wstring *)&catch_id);
                      token::destroy((token *)&_oss);
                      pcVar8 = "parse_statement";
                      expect(&local_3f0,this_01,rparen,"parse_statement",999);
                      token::destroy(&local_3f0);
                      parse_block((parser *)&_oss,check_for_strict_mode);
                      local_5a0 = (undefined1  [8])__oss;
                    }
                    accept((parser *)&_oss,iVar5,(sockaddr *)0x4a,(socklen_t *)pcVar8);
                    uVar3 = __oss;
                    token::destroy((token *)&_oss);
                    if (uVar3 != L'r') {
                      parse_block((parser *)&_oss,check_for_strict_mode);
                      local_5a8 = (pointer)__oss;
                    }
                    make_statement<mjs::try_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::__cxx11::wstring&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                              (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                     *)this_01,
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_598,
                               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                *)local_5a0,
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               &catch_id);
                    std::__cxx11::wstring::~wstring((wstring *)&catch_id);
                    if (local_5a8 != (pointer)0x0) {
                      (**(code **)(*(long *)local_5a8 + 8))();
                    }
                    if (local_5a0 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_5a0 + 8))();
                    }
                  }
                }
                else {
                  if (this_01->line_break_skipped_ == true) {
                    unhandled(this_01,"parse_statement",0x3d5);
                  }
                  parse_expression((parser *)&_oss);
                  expect_semicolon_allow_insertion(this_01,"parse_statement",0x3d8);
                  make_statement<mjs::throw_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                            (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                   *)this_01);
                  local_598 = (undefined1  [8])__oss;
                }
              }
              else {
                expect(&local_300,this_01,lparen,"parse_statement",0x3af);
                token::destroy(&local_300);
                parse_expression((parser *)(local_5e0 + 0x18));
                expect(&local_328,this_01,rparen,"parse_statement",0x3b1);
                token::destroy(&local_328);
                pcVar8 = "parse_statement";
                expect(&local_350,this_01,lbrace,"parse_statement",0x3b2);
                token::destroy(&local_350);
                catch_id.field_2._M_allocated_capacity = 0;
                catch_id._M_dataplus._M_p = (pointer)0x0;
                catch_id._M_string_length = 0;
                local_418 = 0;
                while( true ) {
                  accept((parser *)&_oss,iVar5,(sockaddr *)0x31,(socklen_t *)pcVar8);
                  uVar3 = __oss;
                  token::destroy((token *)&_oss);
                  if (uVar3 != L'r') break;
                  accept((parser *)&_oss,iVar5,(sockaddr *)0x40,(socklen_t *)pcVar8);
                  uVar3 = __oss;
                  token::destroy((token *)&_oss);
                  if (uVar3 == L'r') {
                    expect(&local_378,this_01,case_,"parse_statement",0x3b9);
                    token::destroy(&local_378);
                    parse_expression((parser *)&_oss);
                    uVar9 = __oss;
                  }
                  else {
                    if ((local_418 & 1) != 0) {
                      unhandled(this_01,"parse_statement",0x3be);
                    }
                    local_418 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                    uVar9 = (pointer)0x0;
                  }
                  expect(&local_3a0,this_01,colon,"parse_statement",0x3c2);
                  token::destroy(&local_3a0);
                  n._M_dataplus._M_p = (pointer)0x0;
                  n._M_string_length = 0;
                  n.field_2._M_allocated_capacity = 0;
                  while( true ) {
                    uVar1 = this_00->type_ - case_;
                    pcVar8 = (char *)(ulong)uVar1;
                    if (((uVar1 < 0x3a) && ((0x200000000000081U >> ((ulong)pcVar8 & 0x3f) & 1) != 0)
                        ) || (this_00->type_ == rbrace)) break;
                    parse_statement((parser *)&_oss,check_for_strict_mode);
                    std::
                    vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                    ::
                    emplace_back<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                              ((vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                                *)&n,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                      *)&_oss);
                    if ((pointer)__oss != (pointer)0x0) {
                      (**(code **)(*(long *)__oss + 8))();
                    }
                  }
                  local_588._0_8_ = n._M_dataplus._M_p;
                  local_588._8_8_ = n._M_string_length;
                  local_588._16_8_ = n.field_2._M_allocated_capacity;
                  n._M_dataplus._M_p = (pointer)0x0;
                  n._M_string_length = 0;
                  n.field_2._M_allocated_capacity = 0;
                  __oss = uVar9;
                  std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::
                  emplace_back<mjs::case_clause>
                            ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)
                             &catch_id,(case_clause *)&_oss);
                  case_clause::~case_clause((case_clause *)&_oss);
                  std::
                  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                             *)&n);
                }
                make_statement<mjs::switch_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<mjs::case_clause,std::allocator<mjs::case_clause>>>
                          (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)this_01,
                           (vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)
                           (local_5e0 + 0x18));
                std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::~vector
                          ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)&catch_id)
                ;
                local_598 = (undefined1  [8])local_5c8.ivalue_;
              }
            }
            else {
              __oss = (pointer)0x0;
              if ((this_01->line_break_skipped_ == false) &&
                 ((this_01->current_token_).type_ != semicolon)) {
                parse_expression((parser *)&catch_id);
                __oss = catch_id._M_dataplus._M_p;
              }
              expect_semicolon_allow_insertion(this_01,"parse_statement",0x3a3);
              make_statement<mjs::return_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                        (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                              this_01);
              local_598 = (undefined1  [8])__oss;
            }
            goto LAB_0017e2c9;
          }
          get_label_abi_cxx11_((wstring *)&_oss,this_01);
          expect_semicolon_allow_insertion(this_01,"parse_statement",0x39b);
          make_statement<mjs::break_statement,std::__cxx11::wstring>
                    (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)this_01);
        }
        else {
          get_label_abi_cxx11_((wstring *)&_oss,this_01);
          expect_semicolon_allow_insertion(this_01,"parse_statement",0x397);
          make_statement<mjs::continue_statement,std::__cxx11::wstring>
                    (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)this_01);
        }
        std::__cxx11::wstring::~wstring((wstring *)&_oss);
        goto LAB_0017e2d4;
      }
      expect(&local_170,this_01,lparen,"parse_statement",0x36f);
      token::destroy(&local_170);
      parse_expression((parser *)&_oss);
      expect(&local_198,this_01,rparen,"parse_statement",0x371);
      token::destroy(&local_198);
      parse_statement((parser *)&catch_id,check_for_strict_mode);
      make_statement<mjs::while_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&_oss);
    }
    else {
      parse_statement((parser *)&_oss,check_for_strict_mode);
      expect(&local_f8,this_01,while_,"parse_statement",0x368);
      token::destroy(&local_f8);
      expect(&local_120,this_01,lparen,"parse_statement",0x369);
      token::destroy(&local_120);
      parse_expression((parser *)&catch_id);
      expect(&local_148,this_01,rparen,"parse_statement",0x36b);
      token::destroy(&local_148);
      expect_semicolon_allow_insertion(this_01,"parse_statement",0x36c);
      make_statement<mjs::do_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&catch_id);
    }
LAB_0017e2b2:
    local_598 = (undefined1  [8])__oss;
    if (catch_id._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)catch_id._M_dataplus._M_p + 8))();
      local_598 = (undefined1  [8])__oss;
    }
  }
  else {
    expect(&local_80,this_01,lparen,"parse_statement",0x35f);
    token::destroy(&local_80);
    parse_expression((parser *)&catch_id);
    pcVar8 = "parse_statement";
    expect(&local_a8,this_01,rparen,"parse_statement",0x361);
    token::destroy(&local_a8);
    parse_statement((parser *)&n,check_for_strict_mode);
    accept((parser *)&local_d0,iVar5,(sockaddr *)0x34,(socklen_t *)pcVar8);
    token::destroy(&local_d0);
    accept((parser *)&_oss,iVar5,(sockaddr *)0x44,(socklen_t *)pcVar8);
    if (__oss == L'r') {
      local_5c8.ivalue_ = 0;
    }
    else {
      parse_statement((parser *)(local_5e0 + 0x18),check_for_strict_mode);
    }
    token::destroy((token *)&_oss);
    make_statement<mjs::if_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this_01,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&catch_id,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&n);
    uVar9 = local_5c8.ivalue_;
LAB_0017e201:
    uVar10 = n._M_dataplus._M_p;
    if ((pointer)uVar9 != (pointer)0x0) {
      (**(code **)(*(long *)uVar9 + 8))();
      uVar10 = n._M_dataplus;
    }
LAB_0017e211:
    local_598 = (undefined1  [8])catch_id._M_dataplus._M_p;
    if ((pointer)uVar10 != (pointer)0x0) {
      (**(code **)(*(long *)uVar10 + 8))();
      local_598 = (undefined1  [8])catch_id._M_dataplus;
    }
  }
LAB_0017e2c9:
  if (local_598 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_598 + 8))();
  }
LAB_0017e2d4:
  position_stack_node::~position_stack_node(&_statement_position__LINE__);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr parse_statement(bool check_for_strict_mode = false) {
        RECORD_STATEMENT_START;
        // Statement :
        //  Block
        //  VariableStatement
        //  EmptyStatement
        //  ExpressionStatement
        //  IfStatement
        //  IterationStatement
        //  ContinueStatement
        //  BreakStatement
        //  ReturnStatement
        //  WithStatement
        //  LabelledStatement
        //  SwitchStatement
        //  ThrowStatement
        //  TryStatement

        if (current_token_type() == token_type::lbrace) {
            return parse_block();
        } else if (accept(token_type::function_)) {
            const auto id_extend = current_extend();
            auto id = EXPECT(token_type::identifier).text();
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_statement<function_definition>(extend, id, std::move(params), std::move(block));
        } else if (accept(token_type::var_)) {
            auto dl = parse_variable_declaration_list();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<variable_statement>(std::move(dl));
        } else if (current_token_type() == token_type::semicolon) {
            get_token();
            return make_statement<empty_statement>();
        } else if (accept(token_type::if_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            auto if_s = parse_statement();
            accept(token_type::semicolon);
            auto else_s = accept(token_type::else_) ? parse_statement() : statement_ptr{};
            return make_statement<if_statement>(std::move(cond), std::move(if_s), std::move(else_s));
        } else if (/*version_ >= version::es3 && */accept(token_type::do_)) {
            auto s = parse_statement();
            EXPECT(token_type::while_);
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<do_statement>(std::move(cond), std::move(s));
        } else if (accept(token_type::while_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<while_statement>(std::move(cond), parse_statement());
        } else if (accept(token_type::for_)) {
            statement_ptr init{};
            expression_ptr cond{}, iter{};
            EXPECT(token_type::lparen);
            if (!accept(token_type::semicolon)) {
                // HACK: to support "NoIn" grammar :(
                supress_in_ = true;
                if (accept(token_type::var_)) {
                    init = make_statement<variable_statement>(parse_variable_declaration_list());
                } else {
                    init = make_statement<expression_statement>(parse_expression());
                }
                supress_in_ = false;
                if (accept(token_type::in_)) {
                    if (init->type() == statement_type::variable && static_cast<variable_statement&>(*init).l().size() != 1) {
                        // Only a single variable assigment is legal
                        UNHANDLED();
                    }

                    auto e = parse_expression();
                    EXPECT(token_type::rparen);
                    return make_statement<for_in_statement>(std::move(init), std::move(e), parse_statement());
                }
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::semicolon)) {
                cond = parse_expression();
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::rparen)) {
                iter = parse_expression();
                EXPECT(token_type::rparen);
            }
            return make_statement<for_statement>(std::move(init), std::move(cond), std::move(iter), parse_statement());
        } else if (accept(token_type::continue_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<continue_statement>(std::move(id));
        } else if (accept(token_type::break_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<break_statement>(std::move(id));
        } else if (accept(token_type::return_)) {
            // no line break before
            expression_ptr e{};
            if (!line_break_skipped_ && current_token_type() != token_type::semicolon) {
                e = parse_expression();
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<return_statement>(std::move(e));
        } else if (current_token_type() == token_type::with_) {
            if (strict_mode_) {
                SYNTAX_ERROR("Strict mode code may not include a WithStatement");
            }
            get_token(); // Consume now that any syntax errors have been reported
            EXPECT(token_type::lparen);
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<with_statement>(std::move(e), parse_statement());
        } else if (/*version_ >= version::es3 && */accept(token_type::switch_)) {
            EXPECT(token_type::lparen);
            auto switch_e = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT(token_type::lbrace);
            clause_list cl;
            bool has_default = false;
            while (!accept(token_type::rbrace)) {
                // CaseClause
                expression_ptr e{};
                if (!accept(token_type::default_)) {
                    EXPECT(token_type::case_);
                    e = parse_expression();
                } else {
                    if (has_default) {
                        // TODO: Better error message when a switch has multiple default clauses
                        UNHANDLED();
                    }
                    has_default = true;
                }
                EXPECT(token_type::colon);
                statement_list sl;
                for (;;) {
                    const auto tt = current_token_type();
                    if (tt == token_type::rbrace
                        || tt == token_type::case_
                        || tt ==  token_type::default_
                        || tt == token_type::eof) {
                        break;
                    }
                    sl.emplace_back(parse_statement());
                }
                cl.push_back(case_clause{std::move(e), std::move(sl)});
            }
            return make_statement<switch_statement>(std::move(switch_e), std::move(cl));
        } else if (/*version_ >= version::es3 && */accept(token_type::throw_)) {
            // no line break before
            if (line_break_skipped_) {
                // TODO: Give better error message
                UNHANDLED();
            }
            auto e = parse_expression();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<throw_statement>(std::move(e));
        } else if (/*version_ >= version::es3 && */accept(token_type::try_)) {
            auto block = parse_block();
            statement_ptr catch_{}, finally_{};
            std::wstring catch_id;
            if (accept(token_type::catch_)) {
                EXPECT(token_type::lparen);
                if (strict_mode_ && current_token_type() == token_type::identifier) {
                    auto n = current_token().text();
                    if (is_strict_mode_unassignable_identifier(n)) {
                        SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not be used as an identifier in strict mode");
                    }
                }
                catch_id = EXPECT(token_type::identifier).text();
                EXPECT(token_type::rparen);
                catch_ = parse_block();
            }
            if (accept(token_type::finally_)) {
                finally_ = parse_block();
            }
            return make_statement<try_statement>(std::move(block), std::move(catch_), catch_id, std::move(finally_));
        } else if (/*version_ >= version::es5 && */accept(token_type::debugger_)) {
            auto s = make_statement<debugger_statement>();;
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return s;
        } else {
            auto e = parse_expression();
            if (version_ >= version::es3 && accept(token_type::colon)) {
                if (e->type() != expression_type::identifier) {
                    // TODO: Better error message when encountering an invalid label (or other invalid construct)
                    UNHANDLED();
                }
                return make_statement<labelled_statement>(static_cast<const identifier_expression&>(*e).id(), parse_statement());
            }
            if (check_for_strict_mode && is_strict_mode_directive(*e)) {
                strict_mode_ = true;
#ifdef PARSER_DEBUG
                std::wcout << e->extend() << ": Strict mode enabled\n";
#endif
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<expression_statement>(std::move(e));
        }
    }